

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

uint8 * __thiscall
caffe::HingeLossParameter::InternalSerializeWithCachedSizesToArray
          (HingeLossParameter *this,bool deterministic,uint8 *target)

{
  UnknownFieldSet *unknown_fields;
  uint8 *puVar1;
  
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray(1,this->norm_,target);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return target;
  }
  unknown_fields = HingeLossParameter::unknown_fields(this);
  puVar1 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                     (unknown_fields,target);
  return puVar1;
}

Assistant:

::google::protobuf::uint8* HingeLossParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.HingeLossParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.HingeLossParameter.Norm norm = 1 [default = L1];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      1, this->norm(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.HingeLossParameter)
  return target;
}